

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O3

int __thiscall Configuration::getInt(Configuration *this,string *key,int ifEmpty)

{
  pointer pcVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  Configuration *this_00;
  char *format;
  undefined1 local_48 [32];
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->integerConfiguration)._M_t,key);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->integerConfiguration)._M_t._M_impl.super__Rb_tree_header) {
    pcVar1 = (key->_M_dataplus)._M_p;
    this_00 = (Configuration *)local_48;
    local_48._0_8_ = local_48 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar1,pcVar1 + key->_M_string_length);
    iVar2 = getType(this_00,(string *)local_48);
    if ((undefined1 *)local_48._0_8_ != local_48 + 0x10) {
      operator_delete((void *)local_48._0_8_);
    }
    if (iVar2 == 3) {
      format = "Missing %s in configuration. Using default value: 0%o";
      iVar2 = 0x71;
    }
    else {
      format = "Missing %s in configuration. Using default value: %i";
      iVar2 = 0x75;
    }
    softHSMLog(4,"getInt",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/Configuration.cpp"
               ,iVar2,format,(key->_M_dataplus)._M_p,ifEmpty);
  }
  else {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->integerConfiguration,key);
    ifEmpty = *pmVar4;
  }
  return ifEmpty;
}

Assistant:

int Configuration::getInt(std::string key, int ifEmpty /* = 0 */)
{
	if (integerConfiguration.find(key) != integerConfiguration.end())
	{
		return integerConfiguration[key];
	}
	else
	{
		if (getType(key) == CONFIG_TYPE_INT_OCTAL)
		{
			WARNING_MSG("Missing %s in configuration. Using default value: 0%o", key.c_str(), ifEmpty);
		}
		else
		{
			WARNING_MSG("Missing %s in configuration. Using default value: %i", key.c_str(), ifEmpty);
		}
		return ifEmpty;
	}
}